

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O0

int TIFFAdvanceDirectory(TIFF *tif,uint64_t *nextdiroff,uint64_t *off,tdir_t *nextdirnum)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uStack_98;
  uint16_t dircount16_1;
  uint64_t dircount64_1;
  uint32_t nextdir32_1;
  uint16_t dircount_1;
  uint16_t dircount16;
  uint64_t dircount64;
  tmsize_t poffd_1;
  tmsize_t poffc_1;
  tmsize_t poffb_1;
  tmsize_t poffa_1;
  uint32_t nextdir32;
  uint16_t dircount;
  tmsize_t poffd;
  tmsize_t poffc;
  tmsize_t poffb;
  tmsize_t poffa;
  uint64_t poff;
  tdir_t *nextdirnum_local;
  uint64_t *off_local;
  uint64_t *nextdiroff_local;
  TIFF *tif_local;
  
  poff = (uint64_t)nextdirnum;
  nextdirnum_local = (tdir_t *)off;
  off_local = nextdiroff;
  nextdiroff_local = (uint64_t *)tif;
  iVar1 = _TIFFCheckDirNumberAndOffset(tif,*nextdirnum,*nextdiroff);
  if (iVar1 == 0) {
    TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                  "Starting directory %u at offset 0x%lx (%lu) might cause an IFD loop",
                  (ulong)*(uint *)poff,*off_local,*off_local);
    *off_local = 0;
    *(undefined4 *)poff = 0;
    return 0;
  }
  if ((nextdiroff_local[2] & 0x800) == 0) {
    if ((nextdiroff_local[2] & 0x80000) == 0) {
      iVar1 = _TIFFSeekOK((TIFF *)nextdiroff_local,*off_local);
      if ((iVar1 == 0) ||
         (lVar2 = (*(code *)nextdiroff_local[0x8b])
                            (nextdiroff_local[0x8a],(long)&dircount64_1 + 4,2), lVar2 != 2)) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "%s: Error fetching directory count",*nextdiroff_local);
        return 0;
      }
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabShort((uint16_t *)((long)&dircount64_1 + 4));
      }
      if (nextdirnum_local == (tdir_t *)0x0) {
        (*(code *)nextdiroff_local[0x8d])
                  (nextdiroff_local[0x8a],(uint)dircount64_1._4_2_ * 0xc,1,
                   (uint)dircount64_1._4_2_ * 0xc);
      }
      else {
        uVar3 = (*(code *)nextdiroff_local[0x8d])
                          (nextdiroff_local[0x8a],(uint)dircount64_1._4_2_ * 0xc,1,
                           (uint)dircount64_1._4_2_ * 0xc);
        *(undefined8 *)nextdirnum_local = uVar3;
      }
      lVar2 = (*(code *)nextdiroff_local[0x8b])(nextdiroff_local[0x8a],&dircount64_1,4);
      if (lVar2 != 4) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "%s: Error fetching directory link",*nextdiroff_local);
        return 0;
      }
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabLong((uint32_t *)&dircount64_1);
      }
      *off_local = (ulong)(uint)dircount64_1;
    }
    else {
      iVar1 = _TIFFSeekOK((TIFF *)nextdiroff_local,*off_local);
      if ((iVar1 == 0) ||
         (lVar2 = (*(code *)nextdiroff_local[0x8b])
                            (nextdiroff_local[0x8a],&stack0xffffffffffffff68,8), lVar2 != 8)) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "%s: Error fetching directory count",*nextdiroff_local);
        return 0;
      }
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabLong8(&stack0xffffffffffffff68);
      }
      if (0xffff < uStack_98) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory count");
        return 0;
      }
      if (nextdirnum_local == (tdir_t *)0x0) {
        iVar1 = (uint)(ushort)uStack_98 * 0x14;
        (*(code *)nextdiroff_local[0x8d])(nextdiroff_local[0x8a],iVar1,1,iVar1);
      }
      else {
        iVar1 = (uint)(ushort)uStack_98 * 0x14;
        uVar3 = (*(code *)nextdiroff_local[0x8d])(nextdiroff_local[0x8a],iVar1,1,iVar1);
        *(undefined8 *)nextdirnum_local = uVar3;
      }
      lVar2 = (*(code *)nextdiroff_local[0x8b])(nextdiroff_local[0x8a],off_local,8);
      if (lVar2 != 8) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "%s: Error fetching directory link",*nextdiroff_local);
        return 0;
      }
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabLong8(off_local);
      }
    }
  }
  else {
    poffa = *off_local;
    if ((nextdiroff_local[2] & 0x80000) == 0) {
      poffc = poffa + 2;
      poffb = poffa;
      if (((poffc < poffa) || (poffc < 2)) || ((long)nextdiroff_local[0x87] < poffc)) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory count");
        *off_local = 0;
        return 0;
      }
      _TIFFmemcpy((void *)((long)&poffa_1 + 6),(void *)(nextdiroff_local[0x86] + poffa),2);
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabShort((uint16_t *)((long)&poffa_1 + 6));
      }
      poffd = poffc + (int)((uint)poffa_1._6_2_ * 0xc);
      _nextdir32 = poffd + 4;
      if (((poffd < poffc) || (poffd < (int)((uint)poffa_1._6_2_ * 0xc))) ||
         ((_nextdir32 < poffd || ((_nextdir32 < 4 || ((long)nextdiroff_local[0x87] < _nextdir32)))))
         ) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory link");
        return 0;
      }
      if (nextdirnum_local != (tdir_t *)0x0) {
        *(tmsize_t *)nextdirnum_local = poffd;
      }
      _TIFFmemcpy(&poffa_1,(void *)(nextdiroff_local[0x86] + poffd),4);
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabLong((uint32_t *)&poffa_1);
      }
      *off_local = (ulong)(uint)poffa_1;
    }
    else {
      if (0x7ffffffffffffff7 < (ulong)poffa) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory count");
        return 0;
      }
      poffc_1 = poffa + 8;
      poffb_1 = poffa;
      if ((long)nextdiroff_local[0x87] < poffc_1) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory count");
        return 0;
      }
      _TIFFmemcpy(&nextdir32_1,(void *)(nextdiroff_local[0x86] + poffa),8);
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabLong8((uint64_t *)&nextdir32_1);
      }
      if (0xffff < _nextdir32_1) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Sanity check on directory count failed");
        return 0;
      }
      dircount64_1._6_2_ = (ushort)_nextdir32_1;
      if (0x7ffffffffffffff7 - (long)(int)((uint)dircount64_1._6_2_ * 0x14) < poffc_1) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory link");
        return 0;
      }
      poffd_1 = poffc_1 + (int)((uint)dircount64_1._6_2_ * 0x14);
      dircount64 = poffd_1 + 8;
      if ((long)nextdiroff_local[0x87] < (long)dircount64) {
        TIFFErrorExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "Error fetching directory link");
        return 0;
      }
      if (nextdirnum_local != (tdir_t *)0x0) {
        *(tmsize_t *)nextdirnum_local = poffd_1;
      }
      _TIFFmemcpy(off_local,(void *)(nextdiroff_local[0x86] + poffd_1),8);
      if ((nextdiroff_local[2] & 0x80) != 0) {
        TIFFSwabLong8(off_local);
      }
    }
  }
  if (*off_local != 0) {
    *(int *)poff = *(int *)poff + 1;
    iVar1 = _TIFFCheckDirNumberAndOffset((TIFF *)nextdiroff_local,*(tdir_t *)poff,*off_local);
    if (iVar1 == 0) {
      TIFFWarningExtR((TIFF *)nextdiroff_local,"TIFFAdvanceDirectory",
                      "the next directory %u at offset 0x%lx (%lu) might be an IFD loop. Treating directory %d as last directory"
                      ,(ulong)*(uint *)poff,*off_local,*off_local,*(int *)poff + -1);
      *off_local = 0;
      *(int *)poff = *(int *)poff + -1;
    }
  }
  return 1;
}

Assistant:

static int TIFFAdvanceDirectory(TIFF *tif, uint64_t *nextdiroff, uint64_t *off,
                                tdir_t *nextdirnum)
{
    static const char module[] = "TIFFAdvanceDirectory";

    /* Add this directory to the directory list, if not already in. */
    if (!_TIFFCheckDirNumberAndOffset(tif, *nextdirnum, *nextdiroff))
    {
        TIFFErrorExtR(tif, module,
                      "Starting directory %u at offset 0x%" PRIx64 " (%" PRIu64
                      ") might cause an IFD loop",
                      *nextdirnum, *nextdiroff, *nextdiroff);
        *nextdiroff = 0;
        *nextdirnum = 0;
        return (0);
    }

    if (isMapped(tif))
    {
        uint64_t poff = *nextdiroff;
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            tmsize_t poffa, poffb, poffc, poffd;
            uint16_t dircount;
            uint32_t nextdir32;
            poffa = (tmsize_t)poff;
            poffb = poffa + sizeof(uint16_t);
            if (((uint64_t)poffa != poff) || (poffb < poffa) ||
                (poffb < (tmsize_t)sizeof(uint16_t)) || (poffb > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                *nextdiroff = 0;
                return (0);
            }
            _TIFFmemcpy(&dircount, tif->tif_base + poffa, sizeof(uint16_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount);
            poffc = poffb + dircount * 12;
            poffd = poffc + sizeof(uint32_t);
            if ((poffc < poffb) || (poffc < dircount * 12) || (poffd < poffc) ||
                (poffd < (tmsize_t)sizeof(uint32_t)) || (poffd > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory link");
                return (0);
            }
            if (off != NULL)
                *off = (uint64_t)poffc;
            _TIFFmemcpy(&nextdir32, tif->tif_base + poffc, sizeof(uint32_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&nextdir32);
            *nextdiroff = nextdir32;
        }
        else
        {
            tmsize_t poffa, poffb, poffc, poffd;
            uint64_t dircount64;
            uint16_t dircount16;
            if (poff > (uint64_t)TIFF_TMSIZE_T_MAX - sizeof(uint64_t))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                return (0);
            }
            poffa = (tmsize_t)poff;
            poffb = poffa + sizeof(uint64_t);
            if (poffb > tif->tif_size)
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                return (0);
            }
            _TIFFmemcpy(&dircount64, tif->tif_base + poffa, sizeof(uint64_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 0xFFFF)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed");
                return (0);
            }
            dircount16 = (uint16_t)dircount64;
            if (poffb > TIFF_TMSIZE_T_MAX - (tmsize_t)(dircount16 * 20) -
                            (tmsize_t)sizeof(uint64_t))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory link");
                return (0);
            }
            poffc = poffb + dircount16 * 20;
            poffd = poffc + sizeof(uint64_t);
            if (poffd > tif->tif_size)
            {
                TIFFErrorExtR(tif, module, "Error fetching directory link");
                return (0);
            }
            if (off != NULL)
                *off = (uint64_t)poffc;
            _TIFFmemcpy(nextdiroff, tif->tif_base + poffc, sizeof(uint64_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(nextdiroff);
        }
    }
    else
    {
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            uint16_t dircount;
            uint32_t nextdir32;
            if (!SeekOK(tif, *nextdiroff) ||
                !ReadOK(tif, &dircount, sizeof(uint16_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory count",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount);
            if (off != NULL)
                *off = TIFFSeekFile(tif, dircount * 12, SEEK_CUR);
            else
                (void)TIFFSeekFile(tif, dircount * 12, SEEK_CUR);
            if (!ReadOK(tif, &nextdir32, sizeof(uint32_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory link",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&nextdir32);
            *nextdiroff = nextdir32;
        }
        else
        {
            uint64_t dircount64;
            uint16_t dircount16;
            if (!SeekOK(tif, *nextdiroff) ||
                !ReadOK(tif, &dircount64, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory count",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 0xFFFF)
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                return (0);
            }
            dircount16 = (uint16_t)dircount64;
            if (off != NULL)
                *off = TIFFSeekFile(tif, dircount16 * 20, SEEK_CUR);
            else
                (void)TIFFSeekFile(tif, dircount16 * 20, SEEK_CUR);
            if (!ReadOK(tif, nextdiroff, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory link",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(nextdiroff);
        }
    }
    if (*nextdiroff != 0)
    {
        (*nextdirnum)++;
        /* Check next directory for IFD looping and if so, set it as last
         * directory. */
        if (!_TIFFCheckDirNumberAndOffset(tif, *nextdirnum, *nextdiroff))
        {
            TIFFWarningExtR(
                tif, module,
                "the next directory %u at offset 0x%" PRIx64 " (%" PRIu64
                ") might be an IFD loop. Treating directory %d as "
                "last directory",
                *nextdirnum, *nextdiroff, *nextdiroff, (int)(*nextdirnum) - 1);
            *nextdiroff = 0;
            (*nextdirnum)--;
        }
    }
    return (1);
}